

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall spirv_cross::Compiler::type_is_top_level_block(Compiler *this,SPIRType *type)

{
  bool bVar1;
  bool local_31;
  SPIRType *type_local;
  Compiler *this_local;
  
  if (type->basetype == Struct) {
    bVar1 = has_decoration(this,(ID)(type->super_IVariant).self.id,Block);
    local_31 = true;
    if (!bVar1) {
      local_31 = has_decoration(this,(ID)(type->super_IVariant).self.id,BufferBlock);
    }
    this_local._7_1_ = local_31;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::type_is_top_level_block(const SPIRType &type) const
{
	if (type.basetype != SPIRType::Struct)
		return false;
	return has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock);
}